

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ManSupportNodes_rec(Nwk_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Nwk_Obj_t *pNStack_20;
  int i;
  Nwk_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  Nwk_Obj_t *pNode_local;
  
  iVar1 = Nwk_ObjIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Nwk_ObjSetTravIdCurrent(pNode);
    iVar1 = Nwk_ObjIsCi(pNode);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Nwk_ObjIsNode( pNode )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkDfs.c"
                      ,0x1ed,"void Nwk_ManSupportNodes_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
      }
      local_24 = 0;
      while( true ) {
        bVar2 = false;
        if (local_24 < pNode->nFanins) {
          pNStack_20 = pNode->pFanio[local_24];
          bVar2 = pNStack_20 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar2) break;
        Nwk_ManSupportNodes_rec(pNStack_20,vNodes);
        local_24 = local_24 + 1;
      }
    }
    else {
      Vec_PtrPush(vNodes,pNode);
    }
  }
  return;
}

Assistant:

void Nwk_ManSupportNodes_rec( Nwk_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Nwk_ObjIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Nwk_ObjSetTravIdCurrent( pNode );
    // collect the CI
    if ( Nwk_ObjIsCi(pNode) )
    {
        Vec_PtrPush( vNodes, pNode );
        return;
    }
    assert( Nwk_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Nwk_ObjForEachFanin( pNode, pFanin, i )
        Nwk_ManSupportNodes_rec( pFanin, vNodes );
}